

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::
LineSegmentsRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::TransformerLogLin>
::operator()(LineSegmentsRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::TransformerLogLin>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  unsigned_long_long uVar2;
  unsigned_long_long uVar3;
  double dVar4;
  ImVec2 IVar5;
  int iVar6;
  ImU32 IVar7;
  GetterXsYs<unsigned_long_long> *pGVar8;
  TransformerLogLin *pTVar9;
  ImPlotPlot *pIVar10;
  GetterXsYRef<unsigned_long_long> *pGVar11;
  ImDrawVert *pIVar12;
  uint *puVar13;
  ImPlotContext *pIVar14;
  ImPlotContext *pIVar15;
  long lVar16;
  bool bVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  double dVar22;
  double dVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  
  pIVar14 = GImPlot;
  pGVar8 = this->Getter1;
  pTVar9 = this->Transformer;
  iVar6 = pGVar8->Count;
  lVar16 = (long)(((pGVar8->Offset + prim) % iVar6 + iVar6) % iVar6) * (long)pGVar8->Stride;
  uVar2 = *(unsigned_long_long *)((long)pGVar8->Xs + lVar16);
  uVar3 = *(unsigned_long_long *)((long)pGVar8->Ys + lVar16);
  dVar22 = log10((((double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar15 = GImPlot;
  pIVar10 = pIVar14->CurrentPlot;
  dVar4 = (pIVar10->XAxis).Range.Min;
  iVar6 = pTVar9->YAxis;
  fVar18 = (float)((((double)(float)(dVar22 / pIVar14->LogDenX) *
                     ((pIVar10->XAxis).Range.Max - dVar4) + dVar4) - dVar4) * pIVar14->Mx +
                  (double)pIVar14->PixelRange[iVar6].Min.x);
  fVar19 = (float)(((((double)CONCAT44(0x45300000,(int)(uVar3 >> 0x20)) - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) -
                   pIVar10->YAxis[iVar6].Range.Min) * pIVar14->My[iVar6] +
                  (double)pIVar14->PixelRange[iVar6].Min.y);
  pGVar11 = this->Getter2;
  pTVar9 = this->Transformer;
  iVar6 = pGVar11->Count;
  uVar2 = *(unsigned_long_long *)
           ((long)pGVar11->Xs +
           (long)(((prim + pGVar11->Offset) % iVar6 + iVar6) % iVar6) * (long)pGVar11->Stride);
  dVar4 = pGVar11->YRef;
  dVar23 = log10((((double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar10 = pIVar15->CurrentPlot;
  dVar22 = (pIVar10->XAxis).Range.Min;
  iVar6 = pTVar9->YAxis;
  fVar24 = (float)((((double)(float)(dVar23 / pIVar15->LogDenX) *
                     ((pIVar10->XAxis).Range.Max - dVar22) + dVar22) - dVar22) * pIVar15->Mx +
                  (double)pIVar15->PixelRange[iVar6].Min.x);
  fVar25 = (float)((dVar4 - pIVar10->YAxis[iVar6].Range.Min) * pIVar15->My[iVar6] +
                  (double)pIVar15->PixelRange[iVar6].Min.y);
  fVar20 = fVar19;
  if (fVar25 <= fVar19) {
    fVar20 = fVar25;
  }
  bVar17 = false;
  if ((fVar20 < (cull_rect->Max).y) &&
     (fVar20 = (float)(~-(uint)(fVar25 <= fVar19) & (uint)fVar25 |
                      -(uint)(fVar25 <= fVar19) & (uint)fVar19), pfVar1 = &(cull_rect->Min).y,
     *pfVar1 <= fVar20 && fVar20 != *pfVar1)) {
    fVar20 = fVar18;
    if (fVar24 <= fVar18) {
      fVar20 = fVar24;
    }
    bVar17 = false;
    if (fVar20 < (cull_rect->Max).x) {
      fVar20 = (float)(~-(uint)(fVar24 <= fVar18) & (uint)fVar24 |
                      -(uint)(fVar24 <= fVar18) & (uint)fVar18);
      bVar17 = (cull_rect->Min).x <= fVar20 && fVar20 != (cull_rect->Min).x;
    }
  }
  if (bVar17 != false) {
    fVar20 = this->Weight;
    IVar7 = this->Col;
    IVar5 = *uv;
    fVar26 = fVar24 - fVar18;
    fVar27 = fVar25 - fVar19;
    fVar21 = fVar26 * fVar26 + fVar27 * fVar27;
    if (0.0 < fVar21) {
      if (fVar21 < 0.0) {
        fVar21 = sqrtf(fVar21);
      }
      else {
        fVar21 = SQRT(fVar21);
      }
      fVar26 = fVar26 * (1.0 / fVar21);
      fVar27 = fVar27 * (1.0 / fVar21);
    }
    fVar20 = fVar20 * 0.5;
    fVar26 = fVar26 * fVar20;
    fVar20 = fVar20 * fVar27;
    pIVar12 = DrawList->_VtxWritePtr;
    (pIVar12->pos).x = fVar20 + fVar18;
    (pIVar12->pos).y = fVar19 - fVar26;
    pIVar12->uv = IVar5;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12->col = IVar7;
    pIVar12[1].pos.x = fVar20 + fVar24;
    pIVar12[1].pos.y = fVar25 - fVar26;
    pIVar12[1].uv = IVar5;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[1].col = IVar7;
    pIVar12[2].pos.x = fVar24 - fVar20;
    pIVar12[2].pos.y = fVar26 + fVar25;
    pIVar12[2].uv = IVar5;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[2].col = IVar7;
    pIVar12[3].pos.x = fVar18 - fVar20;
    pIVar12[3].pos.y = fVar26 + fVar19;
    pIVar12[3].uv = IVar5;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[3].col = IVar7;
    DrawList->_VtxWritePtr = pIVar12 + 4;
    puVar13 = DrawList->_IdxWritePtr;
    *puVar13 = DrawList->_VtxCurrentIdx;
    puVar13[1] = DrawList->_VtxCurrentIdx + 1;
    puVar13[2] = DrawList->_VtxCurrentIdx + 2;
    puVar13[3] = DrawList->_VtxCurrentIdx;
    puVar13[4] = DrawList->_VtxCurrentIdx + 2;
    puVar13[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar13 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
  }
  return bVar17;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P1 = Transformer(Getter1(prim));
        ImVec2 P2 = Transformer(Getter2(prim));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        return true;
    }